

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int uv__udp_maybe_deferred_bind(uv_udp_t *handle,int domain,uint flags)

{
  uint addrlen;
  int iVar1;
  sockaddr_in6 *addr;
  uchar taddr [28];
  
  iVar1 = 0;
  if ((handle->io_watcher).fd == -1) {
    if (domain == 10) {
      taddr[0x18] = '\0';
      taddr[0x19] = '\0';
      taddr[0x1a] = '\0';
      taddr[0x1b] = '\0';
      taddr[0] = '\n';
      taddr[1] = '\0';
      taddr[2] = '\0';
      taddr[3] = '\0';
      taddr[4] = '\0';
      taddr[5] = '\0';
      taddr[6] = '\0';
      taddr[7] = '\0';
      taddr._8_4_ = (undefined4)_in6addr_any;
      taddr._12_4_ = (undefined4)((ulong)_in6addr_any >> 0x20);
      taddr._16_4_ = (undefined4)_isatty;
      taddr._20_4_ = (undefined4)((ulong)_isatty >> 0x20);
      addrlen = 0x1c;
    }
    else {
      if (domain != 2) {
        __assert_fail("0 && \"unsupported address family\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/udp.c"
                      ,0x17a,"int uv__udp_maybe_deferred_bind(uv_udp_t *, int, unsigned int)");
      }
      taddr[8] = '\0';
      taddr[9] = '\0';
      taddr[10] = '\0';
      taddr[0xb] = '\0';
      taddr[0xc] = '\0';
      taddr[0xd] = '\0';
      taddr[0xe] = '\0';
      taddr[0xf] = '\0';
      taddr[0] = '\x02';
      taddr[1] = '\0';
      taddr[2] = '\0';
      taddr[3] = '\0';
      taddr[4] = '\0';
      taddr[5] = '\0';
      taddr[6] = '\0';
      taddr[7] = '\0';
      addrlen = 0x10;
    }
    iVar1 = uv__udp_bind(handle,(sockaddr *)taddr,addrlen,flags);
  }
  return iVar1;
}

Assistant:

static int uv__udp_maybe_deferred_bind(uv_udp_t* handle,
                                       int domain,
                                       unsigned int flags) {
  union {
    struct sockaddr_in6 in6;
    struct sockaddr_in in;
    struct sockaddr addr;
  } taddr;
  socklen_t addrlen;

  if (handle->io_watcher.fd != -1)
    return 0;

  switch (domain) {
  case AF_INET:
  {
    struct sockaddr_in* addr = &taddr.in;
    memset(addr, 0, sizeof *addr);
    addr->sin_family = AF_INET;
    addr->sin_addr.s_addr = INADDR_ANY;
    addrlen = sizeof *addr;
    break;
  }
  case AF_INET6:
  {
    struct sockaddr_in6* addr = &taddr.in6;
    memset(addr, 0, sizeof *addr);
    addr->sin6_family = AF_INET6;
    addr->sin6_addr = in6addr_any;
    addrlen = sizeof *addr;
    break;
  }
  default:
    assert(0 && "unsupported address family");
    abort();
  }

  return uv__udp_bind(handle, &taddr.addr, addrlen, flags);
}